

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlCtxtReadDoc(htmlParserCtxtPtr ctxt,xmlChar *str,char *URL,char *encoding,int options)

{
  xmlParserInputPtr input_00;
  xmlParserInputPtr input;
  int options_local;
  char *encoding_local;
  char *URL_local;
  xmlChar *str_local;
  htmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  else {
    htmlCtxtReset(ctxt);
    htmlCtxtUseOptions(ctxt,options);
    input_00 = xmlCtxtNewInputFromString(ctxt,URL,(char *)str,encoding,0);
    if (input_00 == (xmlParserInputPtr)0x0) {
      ctxt_local = (htmlParserCtxtPtr)0x0;
    }
    else {
      ctxt_local = (htmlParserCtxtPtr)htmlCtxtParseDocument(ctxt,input_00);
    }
  }
  return (htmlDocPtr)ctxt_local;
}

Assistant:

htmlDocPtr
htmlCtxtReadDoc(htmlParserCtxtPtr ctxt, const xmlChar *str,
                const char *URL, const char *encoding, int options)
{
    xmlParserInputPtr input;

    if (ctxt == NULL)
        return (NULL);

    htmlCtxtReset(ctxt);
    htmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromString(ctxt, URL, (const char *) str,
                                      encoding, 0);
    if (input == NULL)
        return(NULL);

    return(htmlCtxtParseDocument(ctxt, input));
}